

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::Cluster::QueueOrWriteFrame(Cluster *this,Frame *frame)

{
  map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
  *this_00;
  _List_node_base *p_Var1;
  uint64_t uVar2;
  bool bVar3;
  Frame *pFVar4;
  mapped_type *pmVar5;
  _Rb_tree_node_base *p_Var6;
  _List_node_base *p_Var7;
  pointer p_Var8;
  uint64_t track_number;
  iterator current_track_iterator;
  vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
  frames_to_erase;
  Frame *frame_to_store;
  
  if ((frame == (Frame *)0x0) || (bVar3 = Frame::IsValid(frame), !bVar3)) {
    bVar3 = false;
  }
  else {
    if (this->write_last_frame_with_duration_ == false) {
      bVar3 = DoWriteFrame(this,frame);
      return bVar3;
    }
    track_number = frame->track_number_;
    pFVar4 = (Frame *)operator_new(0x68);
    Frame::Frame(pFVar4);
    frame_to_store = pFVar4;
    Frame::CopyFrom(pFVar4,frame);
    this_00 = &this->stored_frames_;
    pmVar5 = std::
             map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
             ::operator[](this_00,&track_number);
    std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::push_back
              (pmVar5,&frame_to_store);
    frames_to_erase.
    super__Vector_base<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    frames_to_erase.
    super__Vector_base<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    frames_to_erase.
    super__Vector_base<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pmVar5 = std::
             map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
             ::operator[](this_00,&track_number);
    p_Var7 = (pmVar5->super__List_base<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    current_track_iterator._M_node = p_Var7;
    pmVar5 = std::
             map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
             ::operator[](this_00,&track_number);
    p_Var1 = (pmVar5->super__List_base<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>).
             _M_impl._M_node.super__List_node_base._M_prev;
    while (uVar2 = track_number,
          p_Var8 = frames_to_erase.
                   super__Vector_base<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, p_Var7 != p_Var1) {
      pFVar4 = (Frame *)p_Var7[1]._M_next;
      for (p_Var6 = (this->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(this->stored_frames_)._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        if ((*(uint64_t *)(p_Var6 + 1) != uVar2) &&
           (p_Var8 = frames_to_erase.
                     super__Vector_base<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           (p_Var6[1]._M_parent)->_M_left[2]._M_parent < (_Base_ptr)pFVar4->timestamp_))
        goto LAB_00150d5f;
      }
      bVar3 = DoWriteFrame(this,pFVar4);
      if (pFVar4 != (Frame *)0x0) {
        Frame::~Frame(pFVar4);
      }
      operator_delete(pFVar4);
      if (!bVar3) {
        bVar3 = false;
        goto LAB_00150d84;
      }
      std::
      vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
      ::push_back(&frames_to_erase,&current_track_iterator);
      p_Var7 = (current_track_iterator._M_node)->_M_next;
      current_track_iterator._M_node = p_Var7;
    }
LAB_00150d5f:
    for (; p_Var8 != frames_to_erase.
                     super__Vector_base<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; p_Var8 = p_Var8 + 1) {
      pmVar5 = std::
               map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
               ::operator[](this_00,&track_number);
      std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::erase
                (pmVar5,p_Var8->_M_node);
    }
    bVar3 = true;
LAB_00150d84:
    std::
    _Vector_base<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
    ::~_Vector_base(&frames_to_erase.
                     super__Vector_base<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
                   );
  }
  return bVar3;
}

Assistant:

bool Cluster::QueueOrWriteFrame(const Frame* const frame) {
  if (!frame || !frame->IsValid())
    return false;

  // If |write_last_frame_with_duration_| is not set, then write the frame right
  // away.
  if (!write_last_frame_with_duration_) {
    return DoWriteFrame(frame);
  }

  // Queue the current frame.
  uint64_t track_number = frame->track_number();
  Frame* const frame_to_store = new Frame();
  frame_to_store->CopyFrom(*frame);
  stored_frames_[track_number].push_back(frame_to_store);

  // Iterate through all queued frames in the current track except the last one
  // and write it if it is okay to do so (i.e.) no other track has an held back
  // frame with timestamp <= the timestamp of the frame in question.
  std::vector<std::list<Frame*>::iterator> frames_to_erase;
  for (std::list<Frame*>::iterator
           current_track_iterator = stored_frames_[track_number].begin(),
           end = --stored_frames_[track_number].end();
       current_track_iterator != end; ++current_track_iterator) {
    const Frame* const frame_to_write = *current_track_iterator;
    bool okay_to_write = true;
    for (FrameMapIterator track_iterator = stored_frames_.begin();
         track_iterator != stored_frames_.end(); ++track_iterator) {
      if (track_iterator->first == track_number) {
        continue;
      }
      if (track_iterator->second.front()->timestamp() <
          frame_to_write->timestamp()) {
        okay_to_write = false;
        break;
      }
    }
    if (okay_to_write) {
      const bool wrote_frame = DoWriteFrame(frame_to_write);
      delete frame_to_write;
      if (!wrote_frame)
        return false;
      frames_to_erase.push_back(current_track_iterator);
    } else {
      break;
    }
  }
  for (std::vector<std::list<Frame*>::iterator>::iterator iterator =
           frames_to_erase.begin();
       iterator != frames_to_erase.end(); ++iterator) {
    stored_frames_[track_number].erase(*iterator);
  }
  return true;
}